

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O3

int ipc_helper(int listen_after_write)

{
  int iVar1;
  int extraout_EAX;
  int iVar2;
  int extraout_EAX_00;
  uint uVar3;
  int extraout_EAX_01;
  uv_tcp_t *puVar4;
  uv_pipe_t *puVar5;
  tcp_conn *ptVar6;
  uv_loop_t *puVar7;
  undefined8 uVar8;
  void *pvVar9;
  undefined8 *extraout_RDX;
  undefined1 *puVar10;
  uv_loop_t *puVar11;
  char *pcVar12;
  uv_pipe_t *puVar13;
  uv_write_t *puVar14;
  ulong uVar15;
  sockaddr_in addr;
  undefined1 auStack_110 [16];
  uv_pipe_t *puStack_100;
  undefined1 auStack_f8 [16];
  undefined1 auStack_e8 [16];
  uv_pipe_t *puStack_d8;
  undefined1 auStack_c8 [8];
  code *pcStack_c0;
  uv_pipe_t *puStack_b8;
  undefined1 auStack_80 [16];
  uv_pipe_t *puStack_70;
  undefined1 auStack_68 [16];
  uv_pipe_t *puStack_58;
  undefined1 auStack_48 [8];
  undefined8 uStack_40;
  undefined1 local_30 [16];
  undefined1 local_20 [16];
  
  puVar5 = (uv_pipe_t *)(ulong)(uint)listen_after_write;
  pcVar12 = "0.0.0.0";
  iVar2 = 0x23a3;
  uStack_40 = (code *)0x16274b;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,local_30);
  if (iVar1 == 0) {
    uStack_40 = (code *)0x162758;
    puVar4 = (uv_tcp_t *)uv_default_loop();
    iVar2 = 0x2e6b38;
    uStack_40 = (code *)0x16276c;
    iVar1 = uv_pipe_init(puVar4,&channel,1);
    if (iVar1 != 0) goto LAB_001628f5;
    iVar2 = 0;
    uStack_40 = (code *)0x162785;
    uv_pipe_open(&channel);
    puVar13 = &channel;
    uStack_40 = (code *)0x16278d;
    iVar1 = uv_is_readable();
    puVar4 = (uv_tcp_t *)puVar13;
    if (iVar1 != 1) goto LAB_001628fa;
    puVar13 = &channel;
    uStack_40 = (code *)0x1627a2;
    iVar1 = uv_is_writable();
    puVar4 = (uv_tcp_t *)puVar13;
    if (iVar1 != 1) goto LAB_001628ff;
    puVar13 = &channel;
    uStack_40 = (code *)0x1627b7;
    iVar1 = uv_is_closing();
    puVar4 = (uv_tcp_t *)puVar13;
    if (iVar1 != 0) goto LAB_00162904;
    uStack_40 = (code *)0x1627c4;
    puVar4 = (uv_tcp_t *)uv_default_loop();
    iVar2 = 0x2e6c40;
    uStack_40 = (code *)0x1627d3;
    iVar1 = uv_tcp_init();
    if (iVar1 != 0) goto LAB_00162909;
    puVar4 = &tcp_server;
    puVar10 = local_30;
    uStack_40 = (code *)0x1627ee;
    iVar1 = uv_tcp_bind(&tcp_server,puVar10,0);
    iVar2 = (int)puVar10;
    if (iVar1 != 0) goto LAB_0016290e;
    if (listen_after_write != 0) {
LAB_0016281a:
      uStack_40 = (code *)0x16282b;
      local_20 = uv_buf_init("hello\n",6);
      puVar14 = &write_req;
      iVar2 = 0x2e6b38;
      uStack_40 = (code *)0x16285c;
      iVar1 = uv_write2(&write_req,&channel,local_20,1,&tcp_server,0);
      puVar4 = (uv_tcp_t *)puVar14;
      if (iVar1 != 0) goto LAB_00162913;
      if (listen_after_write == 0) {
LAB_00162888:
        uStack_40 = (code *)0x16288d;
        notify_parent_process();
        uStack_40 = (code *)0x162892;
        puVar4 = (uv_tcp_t *)uv_default_loop();
        iVar2 = 0;
        uStack_40 = (code *)0x16289c;
        iVar1 = uv_run();
        if (iVar1 != 0) goto LAB_00162918;
        if (connection_accepted == '\0') goto LAB_0016291d;
        if (close_cb_called != 3) goto LAB_00162922;
        uStack_40 = (code *)0x1628b7;
        puVar5 = (uv_pipe_t *)uv_default_loop();
        uStack_40 = (code *)0x1628cb;
        uv_walk(puVar5,close_walk_cb,0);
        iVar2 = 0;
        uStack_40 = (code *)0x1628d5;
        uv_run(puVar5);
        uStack_40 = (code *)0x1628da;
        puVar4 = (uv_tcp_t *)uv_default_loop();
        uStack_40 = (code *)0x1628e2;
        iVar1 = uv_loop_close();
        if (iVar1 == 0) {
          return 0;
        }
        goto LAB_00162927;
      }
      puVar4 = &tcp_server;
      iVar2 = 0x80;
      uStack_40 = (code *)0x162880;
      iVar1 = uv_listen(&tcp_server,0x80,ipc_on_connection);
      if (iVar1 == 0) goto LAB_00162888;
      goto LAB_0016292c;
    }
    puVar4 = &tcp_server;
    iVar2 = 0x80;
    uStack_40 = (code *)0x162812;
    iVar1 = uv_listen(&tcp_server,0x80,ipc_on_connection);
    if (iVar1 == 0) goto LAB_0016281a;
  }
  else {
    uStack_40 = (code *)0x1628f5;
    ipc_helper_cold_1();
    puVar4 = (uv_tcp_t *)pcVar12;
LAB_001628f5:
    uStack_40 = (code *)0x1628fa;
    ipc_helper_cold_2();
LAB_001628fa:
    uStack_40 = (code *)0x1628ff;
    ipc_helper_cold_3();
LAB_001628ff:
    uStack_40 = (code *)0x162904;
    ipc_helper_cold_4();
LAB_00162904:
    uStack_40 = (code *)0x162909;
    ipc_helper_cold_5();
LAB_00162909:
    uStack_40 = (code *)0x16290e;
    ipc_helper_cold_6();
LAB_0016290e:
    uStack_40 = (code *)0x162913;
    ipc_helper_cold_7();
LAB_00162913:
    uStack_40 = (code *)0x162918;
    ipc_helper_cold_9();
LAB_00162918:
    uStack_40 = (code *)0x16291d;
    ipc_helper_cold_11();
LAB_0016291d:
    uStack_40 = (code *)0x162922;
    ipc_helper_cold_12();
LAB_00162922:
    uStack_40 = (code *)0x162927;
    ipc_helper_cold_13();
LAB_00162927:
    uStack_40 = (code *)0x16292c;
    ipc_helper_cold_14();
LAB_0016292c:
    uStack_40 = (code *)0x162931;
    ipc_helper_cold_10();
  }
  uStack_40 = ipc_on_connection;
  ipc_helper_cold_8();
  if (connection_accepted != '\0') {
    return extraout_EAX;
  }
  if (iVar2 == 0) {
    if (puVar4 != &tcp_server) goto LAB_001629fb;
    puStack_58 = (uv_pipe_t *)0x162972;
    iVar1 = uv_tcp_init(tcp_server.loop,0x2e6f20);
    if (iVar1 != 0) goto LAB_00162a00;
    puStack_58 = (uv_pipe_t *)0x16298d;
    iVar1 = uv_accept(&tcp_server,0x2e6f20);
    if (iVar1 != 0) goto LAB_00162a05;
    puStack_58 = (uv_pipe_t *)0x1629a4;
    uv_close(0x2e6f20,close_cb);
    puStack_58 = (uv_pipe_t *)0x1629b5;
    _auStack_48 = uv_buf_init("accepted_connection\n",0x14);
    puStack_58 = (uv_pipe_t *)0x1629e6;
    iVar1 = uv_write2(&conn_notify_req,&channel,auStack_48,1,0,conn_notify_write_cb);
    if (iVar1 == 0) {
      connection_accepted = 1;
      return 0;
    }
  }
  else {
    puStack_58 = (uv_pipe_t *)0x1629fb;
    ipc_on_connection_cold_1();
LAB_001629fb:
    puStack_58 = (uv_pipe_t *)0x162a00;
    ipc_on_connection_cold_2();
LAB_00162a00:
    puStack_58 = (uv_pipe_t *)0x162a05;
    ipc_on_connection_cold_3();
LAB_00162a05:
    puStack_58 = (uv_pipe_t *)0x162a0a;
    ipc_on_connection_cold_4();
  }
  puStack_58 = (uv_pipe_t *)ipc_helper_tcp_connection;
  ipc_on_connection_cold_5();
  puStack_70 = (uv_pipe_t *)0x162a19;
  puStack_58 = puVar5;
  ptVar6 = (tcp_conn *)uv_default_loop();
  iVar1 = 0x2e6b38;
  puStack_70 = (uv_pipe_t *)0x162a2d;
  iVar2 = uv_pipe_init(ptVar6,&channel,1);
  if (iVar2 == 0) {
    puVar5 = &channel;
    iVar1 = 0;
    puStack_70 = (uv_pipe_t *)0x162a46;
    uv_pipe_open(&channel);
    puVar13 = &channel;
    puStack_70 = (uv_pipe_t *)0x162a4e;
    iVar2 = uv_is_readable();
    ptVar6 = (tcp_conn *)puVar13;
    if (iVar2 != 1) goto LAB_00162bcd;
    puVar13 = &channel;
    puStack_70 = (uv_pipe_t *)0x162a63;
    iVar2 = uv_is_writable();
    ptVar6 = (tcp_conn *)puVar13;
    if (iVar2 != 1) goto LAB_00162bd2;
    puVar13 = &channel;
    puStack_70 = (uv_pipe_t *)0x162a78;
    iVar2 = uv_is_closing();
    ptVar6 = (tcp_conn *)puVar13;
    if (iVar2 != 0) goto LAB_00162bd7;
    puStack_70 = (uv_pipe_t *)0x162a85;
    ptVar6 = (tcp_conn *)uv_default_loop();
    iVar1 = 0x2e6c40;
    puStack_70 = (uv_pipe_t *)0x162a94;
    iVar2 = uv_tcp_init();
    if (iVar2 != 0) goto LAB_00162bdc;
    pcVar12 = "0.0.0.0";
    iVar1 = 0x23a3;
    puStack_70 = (uv_pipe_t *)0x162ab0;
    iVar2 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_68);
    ptVar6 = (tcp_conn *)pcVar12;
    if (iVar2 != 0) goto LAB_00162be1;
    puVar4 = &tcp_server;
    puStack_70 = (uv_pipe_t *)0x162ac9;
    iVar1 = (int)auStack_68;
    iVar2 = uv_tcp_bind(&tcp_server,auStack_68,0);
    ptVar6 = (tcp_conn *)puVar4;
    if (iVar2 != 0) goto LAB_00162be6;
    puVar4 = &tcp_server;
    iVar1 = 0x80;
    puStack_70 = (uv_pipe_t *)0x162ae9;
    iVar2 = uv_listen(&tcp_server,0x80,ipc_on_connection_tcp_conn);
    ptVar6 = (tcp_conn *)puVar4;
    if (iVar2 != 0) goto LAB_00162beb;
    puStack_70 = (uv_pipe_t *)0x162af6;
    ptVar6 = (tcp_conn *)uv_default_loop();
    iVar1 = 0x2e6f20;
    puStack_70 = (uv_pipe_t *)0x162b05;
    iVar2 = uv_tcp_init();
    if (iVar2 != 0) goto LAB_00162bf0;
    ptVar6 = (tcp_conn *)0x194b4a;
    iVar1 = 0x23a3;
    puStack_70 = (uv_pipe_t *)0x162b21;
    iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_68);
    if (iVar2 != 0) goto LAB_00162bf5;
    ptVar6 = &conn;
    iVar1 = 0x2e6f20;
    puStack_70 = (uv_pipe_t *)0x162b46;
    iVar2 = uv_tcp_connect(&conn,0x2e6f20,auStack_68,connect_child_process_cb);
    if (iVar2 != 0) goto LAB_00162bfa;
    puStack_70 = (uv_pipe_t *)0x162b53;
    ptVar6 = (tcp_conn *)uv_default_loop();
    iVar1 = 0;
    puStack_70 = (uv_pipe_t *)0x162b5d;
    iVar2 = uv_run();
    if (iVar2 != 0) goto LAB_00162bff;
    if (tcp_conn_read_cb_called != 1) goto LAB_00162c04;
    if (tcp_conn_write_cb_called != 1) goto LAB_00162c09;
    if (close_cb_called != 4) goto LAB_00162c0e;
    puStack_70 = (uv_pipe_t *)0x162b91;
    puVar5 = (uv_pipe_t *)uv_default_loop();
    puStack_70 = (uv_pipe_t *)0x162ba5;
    uv_walk(puVar5,close_walk_cb,0);
    iVar1 = 0;
    puStack_70 = (uv_pipe_t *)0x162baf;
    uv_run(puVar5);
    puStack_70 = (uv_pipe_t *)0x162bb4;
    ptVar6 = (tcp_conn *)uv_default_loop();
    puStack_70 = (uv_pipe_t *)0x162bbc;
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    puStack_70 = (uv_pipe_t *)0x162bcd;
    ipc_helper_tcp_connection_cold_1();
LAB_00162bcd:
    puStack_70 = (uv_pipe_t *)0x162bd2;
    ipc_helper_tcp_connection_cold_2();
LAB_00162bd2:
    puStack_70 = (uv_pipe_t *)0x162bd7;
    ipc_helper_tcp_connection_cold_3();
LAB_00162bd7:
    puStack_70 = (uv_pipe_t *)0x162bdc;
    ipc_helper_tcp_connection_cold_4();
LAB_00162bdc:
    puStack_70 = (uv_pipe_t *)0x162be1;
    ipc_helper_tcp_connection_cold_5();
LAB_00162be1:
    puStack_70 = (uv_pipe_t *)0x162be6;
    ipc_helper_tcp_connection_cold_6();
LAB_00162be6:
    puStack_70 = (uv_pipe_t *)0x162beb;
    ipc_helper_tcp_connection_cold_7();
LAB_00162beb:
    puStack_70 = (uv_pipe_t *)0x162bf0;
    ipc_helper_tcp_connection_cold_8();
LAB_00162bf0:
    puStack_70 = (uv_pipe_t *)0x162bf5;
    ipc_helper_tcp_connection_cold_9();
LAB_00162bf5:
    puStack_70 = (uv_pipe_t *)0x162bfa;
    ipc_helper_tcp_connection_cold_10();
LAB_00162bfa:
    puStack_70 = (uv_pipe_t *)0x162bff;
    ipc_helper_tcp_connection_cold_11();
LAB_00162bff:
    puStack_70 = (uv_pipe_t *)0x162c04;
    ipc_helper_tcp_connection_cold_12();
LAB_00162c04:
    puStack_70 = (uv_pipe_t *)0x162c09;
    ipc_helper_tcp_connection_cold_13();
LAB_00162c09:
    puStack_70 = (uv_pipe_t *)0x162c0e;
    ipc_helper_tcp_connection_cold_14();
LAB_00162c0e:
    puStack_70 = (uv_pipe_t *)0x162c13;
    ipc_helper_tcp_connection_cold_15();
  }
  puStack_70 = (uv_pipe_t *)ipc_on_connection_tcp_conn;
  ipc_helper_tcp_connection_cold_16();
  puStack_70 = puVar5;
  if (iVar1 == 0) {
    puVar14 = (uv_write_t *)ptVar6;
    if (ptVar6 != (tcp_conn *)&tcp_server) goto LAB_00162ced;
    puVar14 = (uv_write_t *)0xf8;
    puVar7 = (uv_loop_t *)malloc(0xf8);
    if (puVar7 == (uv_loop_t *)0x0) goto LAB_00162cf2;
    puVar11 = puVar7;
    puVar14 = (uv_write_t *)tcp_server.loop;
    iVar2 = uv_tcp_init();
    iVar1 = (int)puVar11;
    if (iVar2 != 0) goto LAB_00162cf7;
    puVar4 = &tcp_server;
    puVar11 = puVar7;
    iVar2 = uv_accept();
    iVar1 = (int)puVar11;
    puVar14 = (uv_write_t *)puVar4;
    if (iVar2 != 0) goto LAB_00162cfc;
    auStack_80 = uv_buf_init("hello\n",6);
    puVar14 = &conn_notify_req;
    iVar1 = 0x2e6b38;
    iVar2 = uv_write2(&conn_notify_req,&channel,auStack_80,1,puVar7,0);
    if (iVar2 != 0) goto LAB_00162d01;
    iVar1 = 0x163441;
    puVar14 = (uv_write_t *)puVar7;
    iVar2 = uv_read_start(puVar7,on_read_alloc,on_tcp_child_process_read);
    if (iVar2 == 0) {
      iVar1 = uv_close(puVar7,close_cb);
      return iVar1;
    }
  }
  else {
    ipc_on_connection_tcp_conn_cold_1();
    puVar14 = (uv_write_t *)ptVar6;
LAB_00162ced:
    ipc_on_connection_tcp_conn_cold_2();
LAB_00162cf2:
    ipc_on_connection_tcp_conn_cold_7();
LAB_00162cf7:
    ipc_on_connection_tcp_conn_cold_3();
LAB_00162cfc:
    ipc_on_connection_tcp_conn_cold_4();
LAB_00162d01:
    ipc_on_connection_tcp_conn_cold_5();
  }
  ipc_on_connection_tcp_conn_cold_6();
  if (iVar1 == 0) {
    iVar1 = uv_read_start(((uv_loop_t *)puVar14)->pending_queue[0],on_read_alloc,
                          on_tcp_child_process_read);
    if (iVar1 == 0) {
      return extraout_EAX_00;
    }
  }
  else {
    connect_child_process_cb_cold_1();
  }
  connect_child_process_cb_cold_2();
  memset(buffer,0x2e,100000);
  large_buf = (uv_buf_t)uv_buf_init(buffer,100000);
  uVar8 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar8,&channel,1);
  if (iVar1 == 0) {
    puVar5 = &channel;
    uv_pipe_open(&channel,0);
    iVar1 = uv_is_readable(&channel);
    if (iVar1 != 1) goto LAB_00162e37;
    iVar1 = uv_is_writable(&channel);
    if (iVar1 != 1) goto LAB_00162e3c;
    iVar1 = uv_is_closing(&channel);
    if (iVar1 != 0) goto LAB_00162e41;
    uVar3 = write_until_data_queued();
    if (uVar3 != 0) {
      send_handle_and_close();
    }
    uVar8 = uv_default_loop();
    iVar1 = uv_run(uVar8,0);
    if (iVar1 != 0) goto LAB_00162e46;
    if (closed_handle_write != '\0') {
      puVar5 = (uv_pipe_t *)uv_default_loop();
      uv_walk(puVar5,close_walk_cb,0);
      uv_run(puVar5,0);
      uVar8 = uv_default_loop();
      iVar1 = uv_loop_close(uVar8);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00162e50;
    }
  }
  else {
    ipc_helper_closed_handle_cold_1();
    puVar5 = (uv_pipe_t *)buffer;
LAB_00162e37:
    ipc_helper_closed_handle_cold_2();
LAB_00162e3c:
    ipc_helper_closed_handle_cold_3();
LAB_00162e41:
    ipc_helper_closed_handle_cold_4();
LAB_00162e46:
    ipc_helper_closed_handle_cold_5();
  }
  ipc_helper_closed_handle_cold_6();
LAB_00162e50:
  ipc_helper_closed_handle_cold_7();
  uVar15 = 0;
  puVar13 = (uv_pipe_t *)write_reqs;
  puStack_b8 = puVar5;
  do {
    pcStack_c0 = (code *)0x162e93;
    iVar1 = uv_write(puVar13,&channel,&large_buf,1,closed_handle_large_write_cb);
    if (iVar1 != 0) {
      pcStack_c0 = send_handle_and_close;
      write_until_data_queued_cold_1();
      puStack_d8 = (uv_pipe_t *)0x162ece;
      uVar8 = uv_default_loop();
      puStack_d8 = (uv_pipe_t *)0x162edd;
      iVar1 = uv_tcp_init(uVar8,&tcp_server);
      if (iVar1 == 0) {
        puStack_d8 = (uv_pipe_t *)0x162ef7;
        iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_c8);
        if (iVar1 != 0) goto LAB_00162f5b;
        puStack_d8 = (uv_pipe_t *)0x162f0e;
        iVar1 = uv_tcp_bind(&tcp_server,auStack_c8,0);
        if (iVar1 != 0) goto LAB_00162f60;
        puStack_d8 = (uv_pipe_t *)0x162f3f;
        iVar1 = uv_write2(&write_req,&channel,&large_buf,1,&tcp_server,closed_handle_write_cb);
        if (iVar1 == 0) {
          puStack_d8 = (uv_pipe_t *)0x162f51;
          iVar1 = uv_close(&tcp_server,0);
          return iVar1;
        }
      }
      else {
        puStack_d8 = (uv_pipe_t *)0x162f5b;
        send_handle_and_close_cold_1();
LAB_00162f5b:
        puStack_d8 = (uv_pipe_t *)0x162f60;
        send_handle_and_close_cold_2();
LAB_00162f60:
        puStack_d8 = (uv_pipe_t *)0x162f65;
        send_handle_and_close_cold_3();
      }
      puStack_d8 = (uv_pipe_t *)ipc_helper_bind_twice;
      send_handle_and_close_cold_4();
      puStack_100 = (uv_pipe_t *)0x162f85;
      puStack_d8 = puVar13;
      iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_e8);
      if (iVar1 == 0) {
        puStack_100 = (uv_pipe_t *)0x162f92;
        uVar8 = uv_default_loop();
        puStack_100 = (uv_pipe_t *)0x162fa6;
        iVar1 = uv_pipe_init(uVar8,&channel,1);
        if (iVar1 != 0) goto LAB_0016312f;
        puVar13 = &channel;
        puStack_100 = (uv_pipe_t *)0x162fbf;
        uv_pipe_open(&channel,0);
        puStack_100 = (uv_pipe_t *)0x162fc7;
        iVar1 = uv_is_readable(&channel);
        if (iVar1 != 1) goto LAB_00163134;
        puStack_100 = (uv_pipe_t *)0x162fdc;
        iVar1 = uv_is_writable(&channel);
        if (iVar1 != 1) goto LAB_00163139;
        puStack_100 = (uv_pipe_t *)0x162ff1;
        iVar1 = uv_is_closing(&channel);
        if (iVar1 != 0) goto LAB_0016313e;
        puStack_100 = (uv_pipe_t *)0x16300a;
        auStack_f8 = uv_buf_init("hello\n",6);
        puStack_100 = (uv_pipe_t *)0x163018;
        uVar8 = uv_default_loop();
        puStack_100 = (uv_pipe_t *)0x163027;
        iVar1 = uv_tcp_init(uVar8,&tcp_server);
        if (iVar1 != 0) goto LAB_00163143;
        puStack_100 = (uv_pipe_t *)0x163034;
        uVar8 = uv_default_loop();
        puStack_100 = (uv_pipe_t *)0x163043;
        iVar1 = uv_tcp_init(uVar8,&tcp_server2);
        if (iVar1 != 0) goto LAB_00163148;
        puStack_100 = (uv_pipe_t *)0x16305e;
        iVar1 = uv_tcp_bind(&tcp_server,auStack_e8,0);
        if (iVar1 != 0) goto LAB_0016314d;
        puStack_100 = (uv_pipe_t *)0x163079;
        iVar1 = uv_tcp_bind(&tcp_server2,auStack_e8,0);
        if (iVar1 != 0) goto LAB_00163152;
        puStack_100 = (uv_pipe_t *)0x1630a6;
        iVar1 = uv_write2(&write_req,&channel,auStack_f8,1,&tcp_server,0);
        if (iVar1 != 0) goto LAB_00163157;
        puStack_100 = (uv_pipe_t *)0x1630d3;
        iVar1 = uv_write2(&write_req2,&channel,auStack_f8,1,&tcp_server2,0);
        if (iVar1 != 0) goto LAB_0016315c;
        puStack_100 = (uv_pipe_t *)0x1630e0;
        uVar8 = uv_default_loop();
        puStack_100 = (uv_pipe_t *)0x1630ea;
        iVar1 = uv_run(uVar8,0);
        if (iVar1 != 0) goto LAB_00163161;
        puStack_100 = (uv_pipe_t *)0x1630f3;
        puVar13 = (uv_pipe_t *)uv_default_loop();
        puStack_100 = (uv_pipe_t *)0x163107;
        uv_walk(puVar13,close_walk_cb,0);
        puStack_100 = (uv_pipe_t *)0x163111;
        uv_run(puVar13,0);
        puStack_100 = (uv_pipe_t *)0x163116;
        uVar8 = uv_default_loop();
        puStack_100 = (uv_pipe_t *)0x16311e;
        iVar1 = uv_loop_close(uVar8);
        if (iVar1 == 0) {
          return 0;
        }
      }
      else {
        puStack_100 = (uv_pipe_t *)0x16312f;
        ipc_helper_bind_twice_cold_1();
LAB_0016312f:
        puStack_100 = (uv_pipe_t *)0x163134;
        ipc_helper_bind_twice_cold_2();
LAB_00163134:
        puStack_100 = (uv_pipe_t *)0x163139;
        ipc_helper_bind_twice_cold_3();
LAB_00163139:
        puStack_100 = (uv_pipe_t *)0x16313e;
        ipc_helper_bind_twice_cold_4();
LAB_0016313e:
        puStack_100 = (uv_pipe_t *)0x163143;
        ipc_helper_bind_twice_cold_5();
LAB_00163143:
        puStack_100 = (uv_pipe_t *)0x163148;
        ipc_helper_bind_twice_cold_6();
LAB_00163148:
        puStack_100 = (uv_pipe_t *)0x16314d;
        ipc_helper_bind_twice_cold_7();
LAB_0016314d:
        puStack_100 = (uv_pipe_t *)0x163152;
        ipc_helper_bind_twice_cold_8();
LAB_00163152:
        puStack_100 = (uv_pipe_t *)0x163157;
        ipc_helper_bind_twice_cold_9();
LAB_00163157:
        puStack_100 = (uv_pipe_t *)0x16315c;
        ipc_helper_bind_twice_cold_10();
LAB_0016315c:
        puStack_100 = (uv_pipe_t *)0x163161;
        ipc_helper_bind_twice_cold_11();
LAB_00163161:
        puStack_100 = (uv_pipe_t *)0x163166;
        ipc_helper_bind_twice_cold_12();
      }
      puStack_100 = (uv_pipe_t *)ipc_helper_send_zero;
      ipc_helper_bind_twice_cold_13();
      puStack_100 = puVar13;
      auStack_110 = uv_buf_init(0,0);
      uVar8 = uv_default_loop();
      puVar5 = &channel;
      iVar1 = uv_pipe_init(uVar8,&channel,0);
      if (iVar1 == 0) {
        puVar5 = (uv_pipe_t *)0x0;
        uv_pipe_open(&channel);
        iVar1 = uv_is_readable(&channel);
        if (iVar1 != 1) goto LAB_0016326e;
        iVar1 = uv_is_writable(&channel);
        if (iVar1 != 1) goto LAB_00163273;
        iVar1 = uv_is_closing(&channel);
        if (iVar1 != 0) goto LAB_00163278;
        puVar5 = &channel;
        iVar1 = uv_write(&write_req,&channel,auStack_110,1,send_zero_write_cb);
        if (iVar1 != 0) goto LAB_0016327d;
        uVar8 = uv_default_loop();
        puVar5 = (uv_pipe_t *)0x0;
        iVar1 = uv_run(uVar8);
        if (iVar1 != 0) goto LAB_00163282;
        if (send_zero_write == 1) {
          uVar8 = uv_default_loop();
          uv_walk(uVar8,close_walk_cb,0);
          puVar5 = (uv_pipe_t *)0x0;
          uv_run(uVar8);
          uVar8 = uv_default_loop();
          iVar1 = uv_loop_close(uVar8);
          if (iVar1 == 0) {
            return 0;
          }
          goto LAB_0016328c;
        }
      }
      else {
        ipc_helper_send_zero_cold_1();
LAB_0016326e:
        ipc_helper_send_zero_cold_2();
LAB_00163273:
        ipc_helper_send_zero_cold_3();
LAB_00163278:
        ipc_helper_send_zero_cold_4();
LAB_0016327d:
        ipc_helper_send_zero_cold_5();
LAB_00163282:
        ipc_helper_send_zero_cold_6();
      }
      ipc_helper_send_zero_cold_7();
LAB_0016328c:
      ipc_helper_send_zero_cold_8();
      if ((int)puVar5 != 0) {
        send_zero_write_cb_cold_1();
        pvVar9 = malloc((size_t)puVar5);
        *extraout_RDX = pvVar9;
        extraout_RDX[1] = puVar5;
        return (int)pvVar9;
      }
      send_zero_write = send_zero_write + 1;
      return extraout_EAX_01;
    }
    if (0x12a < uVar15) break;
    uVar15 = uVar15 + 1;
    puVar13 = (uv_pipe_t *)puVar13->write_queue;
  } while (channel.write_queue_size == 0);
  return (int)channel.write_queue_size;
}

Assistant:

int ipc_helper(int listen_after_write) {
  /*
   * This is launched from test-ipc.c. stdin is a duplex channel that we
   * over which a handle will be transmitted.
   */
  struct sockaddr_in addr;
  int r;
  uv_buf_t buf;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_pipe_init(uv_default_loop(), &channel, 1);
  ASSERT(r == 0);

  uv_pipe_open(&channel, 0);

  ASSERT(1 == uv_is_readable((uv_stream_t*) &channel));
  ASSERT(1 == uv_is_writable((uv_stream_t*) &channel));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &channel));

  r = uv_tcp_init(uv_default_loop(), &tcp_server);
  ASSERT(r == 0);

  r = uv_tcp_bind(&tcp_server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  if (!listen_after_write) {
    r = uv_listen((uv_stream_t*)&tcp_server, BACKLOG, ipc_on_connection);
    ASSERT(r == 0);
  }

  buf = uv_buf_init("hello\n", 6);
  r = uv_write2(&write_req, (uv_stream_t*)&channel, &buf, 1,
      (uv_stream_t*)&tcp_server, NULL);
  ASSERT(r == 0);

  if (listen_after_write) {
    r = uv_listen((uv_stream_t*)&tcp_server, BACKLOG, ipc_on_connection);
    ASSERT(r == 0);
  }

  notify_parent_process();
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(connection_accepted == 1);
  ASSERT(close_cb_called == 3);

  MAKE_VALGRIND_HAPPY();
  return 0;
}